

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbi.c
# Opt level: O1

double hcephes_incbi(double aa,double bb,double yy0)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_c8;
  double local_b8;
  double local_98;
  double local_78;
  double local_68;
  double local_40;
  
  dVar15 = 0.0;
  if ((0.0 < yy0) && (dVar15 = 1.0, yy0 < 1.0)) {
    dVar11 = aa;
    dVar12 = yy0;
    local_98 = bb;
    if ((aa <= 1.0) || (bb <= 1.0)) {
      dVar15 = aa / (aa + bb);
      dVar7 = hcephes_incbet(aa,bb,dVar15);
      bVar1 = false;
      local_40 = 1e-06;
      local_78 = 0.0;
      local_c8 = 1.0;
      local_68 = 0.0;
      local_b8 = 1.0;
      bVar2 = false;
      goto LAB_001059e2;
    }
    dVar15 = hcephes_ndtri(yy0);
    if (yy0 <= 0.5) {
      dVar15 = -dVar15;
    }
    else {
      dVar11 = bb;
      dVar12 = 1.0 - yy0;
      local_98 = aa;
    }
    bVar1 = yy0 > 0.5;
    dVar14 = (dVar15 * dVar15 + -3.0) / 6.0;
    dVar16 = 1.0 / (dVar11 + dVar11 + -1.0);
    dVar10 = 1.0 / (local_98 + local_98 + -1.0);
    dVar13 = 2.0 / (dVar16 + dVar10);
    dVar7 = dVar13 + dVar14;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar15 = (dVar15 * dVar7) / dVar13 -
             (-2.0 / (dVar13 * 3.0) + dVar14 + 0.8333333333333334) * (dVar10 - dVar16);
    dVar15 = dVar15 + dVar15;
    if (-745.1332191019412 <= dVar15) {
      dVar15 = exp(dVar15);
      dVar10 = dVar11 / (dVar15 * local_98 + dVar11);
      dVar7 = hcephes_incbet(dVar11,local_98,dVar10);
      bVar2 = false;
      local_78 = 0.0;
      if (0.2 <= ABS((dVar7 - dVar12) / dVar12)) {
        local_40 = 0.0001;
        local_c8 = 1.0;
        local_68 = 0.0;
        local_b8 = 1.0;
        dVar15 = dVar10;
        goto LAB_001059e2;
      }
      local_b8 = 1.0;
      local_c8 = 1.0;
      local_68 = 0.0;
LAB_0010564c:
      dVar15 = dVar10;
      if (!bVar2) {
        dVar13 = hcephes_lgam(dVar11 + local_98);
        dVar14 = hcephes_lgam(dVar11);
        dVar16 = hcephes_lgam(local_98);
        iVar4 = 8;
        local_40 = 2.842170943040401e-14;
        bVar2 = true;
        do {
          dVar8 = dVar7;
          if (iVar4 != 8) {
            dVar8 = hcephes_incbet(dVar11,local_98,dVar10);
          }
          dVar7 = local_68;
          dVar15 = local_78;
          if ((local_68 <= dVar8) && (dVar7 = local_b8, dVar15 = local_c8, dVar8 <= local_b8)) {
            dVar9 = dVar8;
            if (dVar12 <= dVar8) {
              dVar9 = local_68;
              local_b8 = dVar8;
              local_c8 = dVar10;
            }
            local_78 = (double)(~-(ulong)(dVar8 < dVar12) & (ulong)local_78 |
                               -(ulong)(dVar8 < dVar12) & (ulong)dVar10);
            dVar7 = dVar8;
            dVar15 = dVar10;
            local_68 = dVar9;
          }
          if (((dVar15 == 1.0) && (!NAN(dVar15))) || ((dVar15 == 0.0 && (!NAN(dVar15))))) break;
          dVar10 = log(dVar15);
          dVar8 = log(1.0 - dVar15);
          dVar10 = dVar10 * (dVar11 + -1.0) + dVar8 * (local_98 + -1.0) +
                   ((dVar13 - dVar14) - dVar16);
          if (dVar10 < -745.1332191019412) goto LAB_00105d95;
          if (709.782712893384 < dVar10) break;
          dVar8 = exp(dVar10);
          dVar8 = (dVar7 - dVar12) / dVar8;
          dVar10 = dVar15 - dVar8;
          if (dVar10 <= local_78) {
            dVar7 = (dVar15 - local_78) / (local_c8 - local_78);
            dVar10 = dVar7 * 0.5 * (dVar15 - local_78) + local_78;
            if (dVar10 <= 0.0) break;
          }
          if (local_c8 <= dVar10) {
            dVar7 = (local_c8 - dVar15) / (local_c8 - local_78);
            dVar10 = dVar7 * -0.5 * (local_c8 - dVar15) + local_c8;
            if (1.0 <= dVar10) break;
          }
          dVar15 = dVar10;
          if (ABS(dVar8 / dVar10) < 1.4210854715202004e-14) goto LAB_00105d95;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
LAB_001059e2:
        dVar10 = dVar15;
LAB_00105a02:
        iVar4 = 0;
        iVar5 = 100;
        dVar15 = 0.5;
        do {
          if (iVar5 != 100) {
            dVar13 = local_c8 - local_78;
            dVar7 = dVar15 * dVar13 + local_78;
            uVar6 = -(ulong)(dVar7 == 1.0);
            dVar10 = (double)(uVar6 & 0x3fefffffffffffff | ~uVar6 & (ulong)dVar7);
            if ((dVar10 == 0.0) && (!NAN(dVar10))) {
              dVar10 = dVar13 * 0.5 + local_78;
              dVar15 = 0.5;
              if ((dVar10 == 0.0) && (!NAN(dVar10))) goto LAB_00105573;
            }
            dVar7 = hcephes_incbet(dVar11,local_98,dVar10);
            if ((ABS(dVar13 / (local_78 + local_c8)) < local_40) ||
               (ABS((dVar7 - dVar12) / dVar12) < local_40)) goto LAB_0010564c;
          }
          if (dVar12 <= dVar7) {
            if ((bVar1) && (dVar10 < 1.1102230246251565e-16)) {
              bVar1 = true;
              goto LAB_00105d90;
            }
            dVar13 = 0.5;
            iVar3 = 0;
            if (iVar4 < 1) {
              iVar3 = iVar4;
              if (iVar4 < -3) {
                dVar13 = dVar15 * dVar15;
              }
              else if (iVar4 < -1) {
                dVar13 = dVar15 * 0.5;
              }
              else {
                dVar13 = (dVar7 - dVar12) / (dVar7 - local_68);
              }
            }
            iVar4 = iVar3 + -1;
            local_c8 = dVar10;
            local_b8 = dVar7;
          }
          else {
            if (iVar4 < 0) {
              iVar4 = 0;
              dVar13 = 0.5;
            }
            else if (iVar4 < 4) {
              if (iVar4 < 2) {
                dVar13 = (dVar12 - dVar7) / (local_b8 - dVar7);
              }
              else {
                dVar13 = dVar15 * 0.5 + 0.5;
              }
            }
            else {
              dVar13 = 1.0 - (1.0 - dVar15) * (1.0 - dVar15);
            }
            if (0.75 < dVar10) goto LAB_00105c42;
            iVar4 = iVar4 + 1;
            local_78 = dVar10;
            local_68 = dVar7;
          }
          iVar5 = iVar5 + -1;
          dVar15 = dVar13;
          if (iVar5 == 0) {
            hcephes_mtherr("incbi",6);
            if (local_78 < 1.0) {
              if (dVar10 <= 0.0) goto LAB_00105573;
              goto LAB_0010564c;
            }
            dVar15 = 0.9999999999999999;
            break;
          }
        } while( true );
      }
    }
    else {
LAB_00105573:
      hcephes_mtherr("incbi",4);
LAB_00105d90:
      dVar15 = 0.0;
    }
LAB_00105d95:
    if (bVar1) {
      if (dVar15 <= 1.1102230246251565e-16) {
        dVar15 = 0.9999999999999999;
      }
      else {
        dVar15 = 1.0 - dVar15;
      }
    }
  }
  return dVar15;
LAB_00105c42:
  dVar11 = aa;
  local_98 = bb;
  dVar12 = yy0;
  if (!bVar1) {
    dVar11 = bb;
    local_98 = aa;
    dVar12 = 1.0 - yy0;
  }
  bVar1 = !bVar1;
  dVar10 = 1.0 - dVar10;
  dVar7 = hcephes_incbet(dVar11,local_98,dVar10);
  local_78 = 0.0;
  local_c8 = 1.0;
  local_68 = 0.0;
  local_b8 = 1.0;
  goto LAB_00105a02;
}

Assistant:

HCEPHES_API double hcephes_incbi(double aa, double bb, double yy0) {
    double a, b, y0, d, y, x, x0, x1, lgm, yp, di, dithresh, yl, yh, xt;
    int i, rflg, dir, nflg;

    i = 0;
    if (yy0 <= 0)
        return (0.0);
    if (yy0 >= 1.0)
        return (1.0);
    x0 = 0.0;
    yl = 0.0;
    x1 = 1.0;
    yh = 1.0;
    nflg = 0;

    if (aa <= 1.0 || bb <= 1.0) {
        dithresh = 1.0e-6;
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
        x = a / (a + b);
        y = hcephes_incbet(a, b, x);
        goto ihalve;
    } else {
        dithresh = 1.0e-4;
    }
    /* approximation to inverse function */

    yp = -hcephes_ndtri(yy0);

    if (yy0 > 0.5) {
        rflg = 1;
        a = bb;
        b = aa;
        y0 = 1.0 - yy0;
        yp = -yp;
    } else {
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
    }

    lgm = (yp * yp - 3.0) / 6.0;
    x = 2.0 / (1.0 / (2.0 * a - 1.0) + 1.0 / (2.0 * b - 1.0));
    d = yp * sqrt(x + lgm) / x - (1.0 / (2.0 * b - 1.0) - 1.0 / (2.0 * a - 1.0)) *
                                     (lgm + 5.0 / 6.0 - 2.0 / (3.0 * x));
    d = 2.0 * d;
    if (d < HCEPHES_MINLOG) {
        x = 1.0;
        goto under;
    }
    x = a / (a + b * exp(d));
    y = hcephes_incbet(a, b, x);
    yp = (y - y0) / y0;
    if (fabs(yp) < 0.2)
        goto newt;

/* Resort to interval halving if not close enough. */
ihalve:

    dir = 0;
    di = 0.5;
    for (i = 0; i < 100; i++) {
        if (i != 0) {
            x = x0 + di * (x1 - x0);
            if (x == 1.0)
                x = 1.0 - HCEPHES_MACHEP;
            if (x == 0.0) {
                di = 0.5;
                x = x0 + di * (x1 - x0);
                if (x == 0.0)
                    goto under;
            }
            y = hcephes_incbet(a, b, x);
            yp = (x1 - x0) / (x1 + x0);
            if (fabs(yp) < dithresh)
                goto newt;
            yp = (y - y0) / y0;
            if (fabs(yp) < dithresh)
                goto newt;
        }
        if (y < y0) {
            x0 = x;
            yl = y;
            if (dir < 0) {
                dir = 0;
                di = 0.5;
            } else if (dir > 3)
                di = 1.0 - (1.0 - di) * (1.0 - di);
            else if (dir > 1)
                di = 0.5 * di + 0.5;
            else
                di = (y0 - y) / (yh - yl);
            dir += 1;
            if (x0 > 0.75) {
                if (rflg == 1) {
                    rflg = 0;
                    a = aa;
                    b = bb;
                    y0 = yy0;
                } else {
                    rflg = 1;
                    a = bb;
                    b = aa;
                    y0 = 1.0 - yy0;
                }
                x = 1.0 - x;
                y = hcephes_incbet(a, b, x);
                x0 = 0.0;
                yl = 0.0;
                x1 = 1.0;
                yh = 1.0;
                goto ihalve;
            }
        } else {
            x1 = x;
            if (rflg == 1 && x1 < HCEPHES_MACHEP) {
                x = 0.0;
                goto done;
            }
            yh = y;
            if (dir > 0) {
                dir = 0;
                di = 0.5;
            } else if (dir < -3)
                di = di * di;
            else if (dir < -1)
                di = 0.5 * di;
            else
                di = (y - y0) / (yh - yl);
            dir -= 1;
        }
    }
    hcephes_mtherr("incbi", HCEPHES_PLOSS);
    if (x0 >= 1.0) {
        x = 1.0 - HCEPHES_MACHEP;
        goto done;
    }
    if (x <= 0.0) {
    under:
        hcephes_mtherr("incbi", HCEPHES_UNDERFLOW);
        x = 0.0;
        goto done;
    }

newt:

    if (nflg)
        goto done;
    nflg = 1;
    lgm = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b);

    for (i = 0; i < 8; i++) {
        /* Compute the function at this point. */
        if (i != 0)
            y = hcephes_incbet(a, b, x);
        if (y < yl) {
            x = x0;
            y = yl;
        } else if (y > yh) {
            x = x1;
            y = yh;
        } else if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        if (x == 1.0 || x == 0.0)
            break;
        /* Compute the derivative of the function at this point. */
        d = (a - 1.0) * log(x) + (b - 1.0) * log(1.0 - x) + lgm;
        if (d < HCEPHES_MINLOG)
            goto done;
        if (d > HCEPHES_MAXLOG)
            break;
        d = exp(d);
        /* Compute the step to the next approximation of x. */
        d = (y - y0) / d;
        xt = x - d;
        if (xt <= x0) {
            y = (x - x0) / (x1 - x0);
            xt = x0 + 0.5 * y * (x - x0);
            if (xt <= 0.0)
                break;
        }
        if (xt >= x1) {
            y = (x1 - x) / (x1 - x0);
            xt = x1 - 0.5 * y * (x1 - x);
            if (xt >= 1.0)
                break;
        }
        x = xt;
        if (fabs(d / x) < 128.0 * HCEPHES_MACHEP)
            goto done;
    }
    /* Did not converge.  */
    dithresh = 256.0 * HCEPHES_MACHEP;
    goto ihalve;

done:

    if (rflg) {
        if (x <= HCEPHES_MACHEP)
            x = 1.0 - HCEPHES_MACHEP;
        else
            x = 1.0 - x;
    }
    return (x);
}